

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NullTypeHandler.cpp
# Opt level: O1

BOOL __thiscall
Js::NullTypeHandlerBase::AddProperty
          (NullTypeHandlerBase *this,DynamicObject *instance,PropertyId propertyId,Var value,
          PropertyAttributes attributes,PropertyValueInfo *info,PropertyOperationFlags flags,
          SideEffects possibleSideEffects)

{
  int *piVar1;
  ScriptContext *this_00;
  BOOL BVar2;
  SimpleDictionaryTypeHandlerBase<unsigned_short,_const_Js::PropertyRecord_*,_false> *this_01;
  PropertyRecord *propertyKey;
  SimpleTypeHandler<1UL> *this_02;
  
  if ((this->super_DynamicTypeHandler).field_0x15 == '\x01') {
    if ((DAT_015d6346 != '\0') ||
       ((((this->super_DynamicTypeHandler).flags & 0x10) != 0 && (DAT_015d6345 == '\x01')))) {
      this_00 = (((((instance->super_RecyclableObject).type.ptr)->javascriptLibrary).ptr)->
                super_JavascriptLibraryBase).scriptContext.ptr;
      this_01 = ConvertToTypeHandler<Js::SimpleDictionaryTypeHandlerBase<unsigned_short,Js::PropertyRecord_const*,false>>
                          (this,instance);
      piVar1 = &((((((instance->super_RecyclableObject).type.ptr)->javascriptLibrary).ptr)->
                 super_JavascriptLibraryBase).scriptContext.ptr)->convertNullToSimpleDictionaryCount
      ;
      *piVar1 = *piVar1 + 1;
      propertyKey = ScriptContext::GetPropertyName(this_00,propertyId);
      BVar2 = SimpleDictionaryTypeHandlerBase<unsigned_short,Js::PropertyRecord_const*,false>::
              AddProperty<Js::PropertyRecord_const*>
                        ((SimpleDictionaryTypeHandlerBase<unsigned_short,Js::PropertyRecord_const*,false>
                          *)this_01,instance,propertyKey,value,attributes,info,flags,
                         possibleSideEffects);
      return BVar2;
    }
  }
  this_02 = ConvertToTypeHandler<Js::SimpleTypeHandler<1ul>>(this,instance);
  piVar1 = &((((((instance->super_RecyclableObject).type.ptr)->javascriptLibrary).ptr)->
             super_JavascriptLibraryBase).scriptContext.ptr)->convertNullToSimpleCount;
  *piVar1 = *piVar1 + 1;
  BVar2 = SimpleTypeHandler<1UL>::AddProperty
                    (this_02,instance,propertyId,value,attributes,info,flags,possibleSideEffects);
  return BVar2;
}

Assistant:

BOOL NullTypeHandlerBase::AddProperty(DynamicObject* instance, PropertyId propertyId, Var value, PropertyAttributes attributes, PropertyValueInfo* info, PropertyOperationFlags flags, SideEffects possibleSideEffects)
    {
        if (this->isPrototype && (ChangeTypeOnProto() || (GetIsShared() && IsolatePrototypes())))
        {
            ScriptContext* scriptContext = instance->GetScriptContext();
            return ConvertToSimpleDictionaryType(instance)->AddProperty(instance, scriptContext->GetPropertyName(propertyId), value, attributes, info, flags, possibleSideEffects);
        }
        else
        {
            return ConvertToSimpleType(instance)->AddProperty(instance, propertyId, value, attributes, info, flags, possibleSideEffects);
        }
    }